

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::OutputCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  OutputCase *this_local;
  
  local_18 = this;
  this_local = (OutputCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "uniform mediump float u_special;\nvarying mediump vec2 v_pos;\nvoid main ()\n{\n\tgl_FragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string OutputCase::genFragmentSource (void) const
{
	return
		"uniform mediump float u_special;\n"
		"varying mediump vec2 v_pos;\n"
		"void main ()\n"
		"{\n"
		"	gl_FragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n"
		"}\n";
}